

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c.cc
# Opt level: O1

char * leveldb_env_get_test_directory(leveldb_env_t *env)

{
  size_t __n;
  char *__dest;
  string result;
  undefined1 *local_40;
  size_t local_38;
  undefined1 local_30 [16];
  void *local_20;
  
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  (*env->rep->_vptr_Env[0x13])(&local_20,env->rep,&local_40);
  __n = local_38;
  if (local_20 == (void *)0x0) {
    __dest = (char *)malloc(local_38 + 1);
    memcpy(__dest,local_40,__n);
    __dest[__n] = '\0';
  }
  else {
    operator_delete__(local_20);
    __dest = (char *)0x0;
  }
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return __dest;
}

Assistant:

char* leveldb_env_get_test_directory(leveldb_env_t* env) {
  std::string result;
  if (!env->rep->GetTestDirectory(&result).ok()) {
    return nullptr;
  }

  char* buffer = static_cast<char*>(malloc(result.size() + 1));
  std::memcpy(buffer, result.data(), result.size());
  buffer[result.size()] = '\0';
  return buffer;
}